

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,uint pass)

{
  MOJOSHADER_effectState *pMVar1;
  uint uVar2;
  uint uVar3;
  MOJOSHADER_glProgram *pMVar4;
  MOJOSHADER_effect *pMVar5;
  MOJOSHADER_effectPass *pMVar6;
  MOJOSHADER_effectState *pMVar7;
  MOJOSHADER_effectStateChanges *pMVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  MOJOSHADER_effectObject *pMVar13;
  MOJOSHADER_effectObject *pMVar14;
  
  pMVar4 = ctx->bound_program;
  if (pMVar4 != (MOJOSHADER_glProgram *)0x0) {
    glEffect->current_vert = pMVar4->vertex;
    glEffect->current_frag = pMVar4->fragment;
  }
  pMVar5 = glEffect->effect;
  if (pMVar5->current_pass != -1) {
    __assert_fail("glEffect->effect->current_pass == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0xae3,"void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *, unsigned int)");
  }
  pMVar14 = (MOJOSHADER_effectObject *)glEffect->current_vert_raw;
  pMVar13 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  pMVar5->current_pass = pass;
  pMVar6 = pMVar5->current_technique->passes;
  uVar2 = pMVar6[pass].state_count;
  if ((ulong)uVar2 == 0) {
    bVar9 = true;
  }
  else {
    pMVar7 = pMVar6[pass].states;
    uVar10 = 0;
    bVar9 = false;
    do {
      pMVar1 = pMVar7 + uVar10;
      if (pMVar1->type == MOJOSHADER_RS_VERTEXSHADER) {
        uVar3 = *(pMVar1->value).field_4.valuesI;
        lVar11 = 0;
        uVar12 = 0;
        do {
          if (uVar3 == glEffect->shader_indices[uVar12]) {
            pMVar14 = pMVar5->objects + (int)uVar3;
            glEffect->current_vert =
                 (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar11);
            break;
          }
          if ((glEffect->num_preshaders != 0) && (uVar3 == glEffect->preshader_indices[uVar12])) {
            pMVar14 = pMVar5->objects + (int)uVar3;
            goto LAB_00125dea;
          }
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0x10;
        } while (uVar12 < glEffect->num_shaders);
      }
      else if (pMVar1->type == MOJOSHADER_RS_PIXELSHADER) {
        uVar3 = *(pMVar1->value).field_4.valuesI;
        lVar11 = 0;
        uVar12 = 0;
LAB_00125d3e:
        if (uVar3 == glEffect->shader_indices[uVar12]) {
          pMVar13 = pMVar5->objects + (int)uVar3;
          glEffect->current_frag =
               (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar11);
        }
        else {
          if ((glEffect->num_preshaders == 0) || (uVar3 != glEffect->preshader_indices[uVar12]))
          goto LAB_00125d55;
          pMVar13 = pMVar5->objects + (int)uVar3;
LAB_00125dea:
          bVar9 = true;
        }
      }
LAB_00125df0:
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
    bVar9 = !bVar9;
  }
  pMVar8 = pMVar5->state_changes;
  pMVar8->render_state_changes = pMVar6[pass].states;
  pMVar8->render_state_change_count = uVar2;
  glEffect->current_vert_raw = (MOJOSHADER_effectShader *)pMVar14;
  glEffect->current_frag_raw = (MOJOSHADER_effectShader *)pMVar13;
  if (bVar9) {
    MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
    if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
      pMVar8 = glEffect->effect->state_changes;
      pMVar8->vertex_sampler_state_changes =
           *(MOJOSHADER_samplerStateRegister **)((long)pMVar14 + 0x38);
      pMVar8->vertex_sampler_state_change_count = *(uint *)((long)pMVar14 + 0x30);
    }
    if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
      pMVar8 = glEffect->effect->state_changes;
      pMVar8->sampler_state_changes = *(MOJOSHADER_samplerStateRegister **)((long)pMVar13 + 0x38);
      pMVar8->sampler_state_change_count = *(uint *)((long)pMVar13 + 0x30);
    }
  }
  MOJOSHADER_glEffectCommitChanges(glEffect);
  return;
LAB_00125d55:
  uVar12 = uVar12 + 1;
  lVar11 = lVar11 + 0x10;
  if (glEffect->num_shaders <= uVar12) goto LAB_00125df0;
  goto LAB_00125d3e;
}

Assistant:

void MOJOSHADER_glEffectBeginPass(MOJOSHADER_glEffect *glEffect,
                                  unsigned int pass)
{
    int i, j;
    MOJOSHADER_effectPass *curPass;
    MOJOSHADER_effectState *state;
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;
    int has_preshader = 0;

    if (ctx->bound_program != NULL)
    {
        glEffect->current_vert = ctx->bound_program->vertex;
        glEffect->current_frag = ctx->bound_program->fragment;
    } // if

    assert(glEffect->effect->current_pass == -1);
    glEffect->effect->current_pass = pass;
    curPass = &glEffect->effect->current_technique->passes[pass];

    // !!! FIXME: I bet this could be stored at parse/compile time. -flibit
    for (i = 0; i < curPass->state_count; i++)
    {
        state = &curPass->states[i];
        #define ASSIGN_SHADER(stype, raw, gls) \
            (state->type == stype) \
            { \
                j = 0; \
                do \
                { \
                    if (*state->value.valuesI == glEffect->shader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        glEffect->gls = &glEffect->shaders[j]; \
                        break; \
                    } \
                    else if (glEffect->num_preshaders > 0 \
                          && *state->value.valuesI == glEffect->preshader_indices[j]) \
                    { \
                        raw = &glEffect->effect->objects[*state->value.valuesI].shader; \
                        has_preshader = 1; \
                        break; \
                    } \
                } while (++j < glEffect->num_shaders); \
            }
        if ASSIGN_SHADER(MOJOSHADER_RS_VERTEXSHADER, rawVert, current_vert)
        else if ASSIGN_SHADER(MOJOSHADER_RS_PIXELSHADER, rawFrag, current_frag)
        #undef ASSIGN_SHADER
    } // for

    glEffect->effect->state_changes->render_state_changes = curPass->states;
    glEffect->effect->state_changes->render_state_change_count = curPass->state_count;

    glEffect->current_vert_raw = rawVert;
    glEffect->current_frag_raw = rawFrag;

    /* If this effect pass has an array of shaders, we get to wait until
     * CommitChanges to actually bind the final shaders.
     * -flibit
     */
    if (!has_preshader)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    MOJOSHADER_glEffectCommitChanges(glEffect);
}